

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManCountChoices(Gia_Man_t *p)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  if (((p->pReprs != (Gia_Rpr_t *)0x0) && (iVar1 = 0, p->pNexts != (int *)0x0)) &&
     (0 < (long)p->nObjs)) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return 0;
      }
      iVar1 = iVar1 + (uint)(0 < p->pNexts[lVar2]);
      lVar2 = lVar2 + 1;
    } while (p->nObjs != lVar2);
  }
  return iVar1;
}

Assistant:

int Gia_ManCountChoices( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pReprs == NULL || p->pNexts == NULL )
        return 0;
    Gia_ManForEachObj( p, pObj, i )
        Counter += (int)(Gia_ObjNext( p, i ) > 0);
    return Counter;
}